

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoAtomicStore<unsigned_long,unsigned_char>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  unsigned_long uVar4;
  Memory *this_01;
  string local_90;
  Ptr local_70;
  Enum local_54;
  u64 local_50;
  u64 offset;
  Ref RStack_40;
  uchar val;
  undefined1 local_38 [8];
  Ptr memory;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  memory.root_index_ = (Index)out_trap;
  this_00 = Instance::memories(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  RStack_40.index = pvVar3->index;
  RefPtr<wabt::interp::Memory>::RefPtr((RefPtr<wabt::interp::Memory> *)local_38,pSVar1,RStack_40);
  uVar4 = Pop<unsigned_long>(this);
  offset._7_1_ = (uchar)uVar4;
  local_50 = PopPtr(this,(Ptr *)local_38);
  this_01 = RefPtr<wabt::interp::Memory>::operator->((RefPtr<wabt::interp::Memory> *)local_38);
  local_54 = (Enum)Memory::AtomicStore<unsigned_char>
                             (this_01,local_50,(ulong)instr.field_2.imm_u32x2.snd,offset._7_1_);
  bVar2 = Failed((Result)local_54);
  if (bVar2) {
    pSVar1 = this->store_;
    StringPrintf_abi_cxx11_
              (&local_90,"invalid atomic access at %lu+%u",local_50,
               (ulong)instr.field_2.imm_u32x2.snd);
    Trap::New(&local_70,pSVar1,&local_90,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=
              ((RefPtr<wabt::interp::Trap> *)memory.root_index_,&local_70);
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoAtomicStore(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  V val = static_cast<V>(Pop<T>());
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->AtomicStore(offset, instr.imm_u32x2.snd, val)),
          StringPrintf("invalid atomic access at %" PRIaddress "+%u", offset,
                       instr.imm_u32x2.snd));
  return RunResult::Ok;
}